

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O3

REF_STATUS
ref_part_meshb_cell(REF_CELL ref_cell,REF_LONG ncell,REF_NODE ref_node,REF_LONG nnode,
                   REF_INT version,REF_BOOL pad,FILE *file)

{
  uint uVar1;
  uint uVar2;
  REF_MPI ref_mpi;
  bool bVar3;
  REF_INT *pRVar4;
  uint uVar5;
  ulong uVar6;
  REF_GLOB *c2n;
  long lVar7;
  long lVar8;
  long lVar9;
  int *__ptr;
  undefined4 *puVar10;
  long *__ptr_00;
  void *pvVar11;
  long lVar12;
  long lVar13;
  long *plVar14;
  undefined8 uVar15;
  int iVar16;
  size_t sVar17;
  int iVar18;
  REF_STATUS RVar19;
  ulong uVar20;
  REF_INT *pRVar21;
  REF_INT *pRVar22;
  int iVar23;
  long lVar24;
  REF_GLOB *pRVar25;
  char *pcVar26;
  uint uVar27;
  size_t sVar28;
  ulong uVar29;
  ulong uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  int iVar37;
  undefined1 auVar36 [16];
  undefined1 auVar38 [16];
  REF_INT elements_to_receive;
  REF_INT end_of_message;
  REF_INT zero;
  uint local_ec;
  undefined4 *local_e8;
  void *local_e0;
  REF_INT *local_d8;
  void *local_d0;
  REF_INT *local_c8;
  REF_INT *local_c0;
  REF_CELL local_b8;
  long local_b0;
  ulong local_a8;
  void *local_a0;
  long local_98;
  long local_90;
  size_t local_88;
  long local_80;
  REF_NODE local_78;
  REF_INT local_6c;
  REF_BOOL local_68;
  undefined4 local_64;
  size_t local_60;
  long *local_58;
  long local_50;
  long local_48;
  long local_40;
  undefined1 local_34 [4];
  
  ref_mpi = ref_node->ref_mpi;
  local_64 = 0xffffffff;
  iVar16 = ref_mpi->n;
  uVar6 = ncell / (long)iVar16;
  uVar20 = 1000000;
  if (1000000 < (long)uVar6) {
    uVar20 = uVar6;
  }
  uVar1 = ref_cell->size_per;
  lVar13 = (long)(int)uVar1;
  uVar27 = (uint)uVar20;
  local_b0 = nnode;
  local_78 = ref_node;
  if ((int)(uVar1 * uVar27) < 0) {
    pcVar26 = "malloc sent_c2n of REF_GLOB negative";
    uVar15 = 0x1b4;
LAB_002047f3:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar15,
           "ref_part_meshb_cell",pcVar26);
LAB_002047fa:
    RVar19 = 1;
  }
  else {
    uVar2 = ref_cell->node_per;
    sVar17 = (ulong)(uVar1 * uVar27) << 3;
    local_d8 = (REF_INT *)ncell;
    local_6c = version;
    local_68 = pad;
    c2n = (REF_GLOB *)malloc(sVar17);
    if (c2n == (REF_GLOB *)0x0) {
      pcVar26 = "malloc sent_c2n of REF_GLOB NULL";
      uVar15 = 0x1b4;
    }
    else {
      uVar6 = (ulong)uVar1;
      local_b8 = ref_cell;
      if (ref_mpi->id != 0) {
        lVar12 = local_b0 + -1;
        local_a8 = lVar13 * 8;
        do {
          uVar5 = ref_mpi_scatter_recv(ref_mpi,&local_ec,1,1);
          if (uVar5 != 0) {
            pcVar26 = "recv";
            uVar15 = 0x23f;
            goto LAB_00205462;
          }
          if (0 < (int)local_ec) {
            uVar5 = ref_mpi_scatter_recv(ref_mpi,c2n,local_ec * uVar1,2);
            uVar27 = local_ec;
            if (uVar5 != 0) {
              pcVar26 = "send";
              uVar15 = 0x243;
              goto LAB_00205462;
            }
            uVar20 = (ulong)local_ec;
            uVar5 = local_ec * uVar1;
            if ((int)uVar5 < 0) {
              pcVar26 = "malloc sent_part of REF_INT negative";
              uVar15 = 0x246;
              goto LAB_002047f3;
            }
            local_d8 = (REF_INT *)malloc((ulong)uVar5 << 2);
            if (local_d8 == (REF_INT *)0x0) {
              pcVar26 = "malloc sent_part of REF_INT NULL";
              uVar15 = 0x246;
              local_d8 = (REF_INT *)0x0;
              goto LAB_00204825;
            }
            if (uVar5 != 0) {
              memset(local_d8,0xff,(ulong)uVar5 << 2);
            }
            ref_cell = local_b8;
            pRVar21 = local_d8;
            if (0 < (int)uVar27) {
              uVar6 = 0;
              pRVar22 = local_d8;
              pRVar25 = c2n;
              do {
                if (0 < (int)uVar2) {
                  lVar24 = (long)ref_mpi->n;
                  lVar7 = (lVar12 + lVar24) / lVar24;
                  lVar8 = lVar12 / lVar24;
                  lVar24 = local_b0 - lVar8 * lVar24;
                  uVar29 = 0;
                  do {
                    lVar9 = pRVar25[uVar29] / lVar7;
                    if (lVar24 <= lVar9) {
                      lVar9 = (pRVar25[uVar29] - lVar7 * lVar24) / lVar8 + lVar24;
                    }
                    pRVar22[uVar29] = (REF_INT)lVar9;
                    uVar29 = uVar29 + 1;
                  } while (uVar2 != uVar29);
                }
                uVar6 = uVar6 + 1;
                pRVar25 = (REF_GLOB *)((long)pRVar25 + local_a8);
                pRVar22 = pRVar22 + lVar13;
              } while (uVar6 != uVar20);
            }
            uVar5 = ref_cell_add_many_global(local_b8,local_78,uVar27,c2n,local_d8,ref_mpi->id);
            if (uVar5 != 0) {
              pcVar26 = "many glob";
              uVar15 = 0x250;
              goto LAB_00205462;
            }
            free(pRVar21);
          }
        } while (local_ec != 0xffffffff);
LAB_00204788:
        free(c2n);
        uVar5 = ref_migrate_shufflin_cell(local_78,ref_cell);
        if (uVar5 == 0) {
          return 0;
        }
        pcVar26 = "fill ghosts";
        uVar15 = 0x259;
LAB_00205462:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               uVar15,"ref_part_meshb_cell",(ulong)uVar5,pcVar26);
        return uVar5;
      }
      if (iVar16 < 0) {
        pcVar26 = "malloc elements_to_send of REF_INT negative";
        uVar15 = 0x1b7;
        goto LAB_002047f3;
      }
      sVar28 = (long)iVar16 << 2;
      __ptr = (int *)malloc(sVar28);
      if (__ptr == (int *)0x0) {
        pcVar26 = "malloc elements_to_send of REF_INT NULL";
        uVar15 = 0x1b7;
      }
      else {
        puVar10 = (undefined4 *)malloc(sVar28);
        if (puVar10 == (undefined4 *)0x0) {
          pcVar26 = "malloc start_to_send of REF_INT NULL";
          uVar15 = 0x1b8;
        }
        else {
          __ptr_00 = (long *)malloc(sVar17);
          if (__ptr_00 == (long *)0x0) {
            pcVar26 = "malloc c2n of REF_GLOB NULL";
            uVar15 = 0x1b9;
          }
          else {
            local_88 = (size_t)(int)uVar2;
            local_80 = local_88 + 1;
            uVar5 = (int)local_80 * uVar27;
            if ((int)uVar5 < 0) {
              pcVar26 = "malloc c2n_int of REF_INT negative";
              uVar15 = 0x1ba;
              goto LAB_002047f3;
            }
            pvVar11 = malloc((ulong)uVar5 * 4);
            if (pvVar11 == (void *)0x0) {
              pcVar26 = "malloc c2n_int of REF_INT NULL";
              uVar15 = 0x1ba;
            }
            else {
              local_d0 = pvVar11;
              local_a0 = malloc((ulong)uVar5 << 3);
              if (local_a0 == (void *)0x0) {
                pcVar26 = "malloc c2n_long of REF_LONG NULL";
                uVar15 = 0x1bb;
              }
              else {
                if ((int)uVar27 < 0) {
                  pcVar26 = "malloc dest of REF_INT negative";
                  uVar15 = 0x1bc;
                  goto LAB_002047f3;
                }
                local_e0 = malloc((ulong)(uVar27 & 0x7fffffff) << 2);
                if (local_e0 != (void *)0x0) {
                  local_e8 = puVar10;
                  if (0 < (long)local_d8) {
                    local_90 = local_b0 + -1;
                    local_60 = uVar6 * 8;
                    local_a8 = local_88 & 0xffffffff;
                    local_48 = local_88 * 4;
                    local_98 = local_80 << 2;
                    local_58 = __ptr_00 + 3;
                    local_40 = lVar13 * 4;
                    lVar12 = 0;
                    auVar38 = _DAT_0020d110;
                    do {
                      uVar5 = (int)local_d8 - (int)lVar12;
                      pRVar21 = (REF_INT *)(ulong)uVar5;
                      if ((int)uVar27 < (int)uVar5) {
                        pRVar21 = (REF_INT *)(uVar20 & 0xffffffff);
                      }
                      iVar18 = (int)pRVar21;
                      local_50 = lVar12;
                      if (local_68 == 0) {
                        sVar17 = (size_t)(iVar18 * (int)local_80);
                        if (local_6c < 4) {
                          sVar28 = fread(local_d0,4,sVar17,(FILE *)file);
                          auVar38 = _DAT_0020d110;
                          if (sVar28 != sVar17) {
                            pcVar26 = "int c2n";
                            uVar15 = 0x1d5;
LAB_00205615:
                            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                   ,uVar15,"ref_part_meshb_cell",pcVar26,sVar17,sVar28);
                            goto LAB_002047fa;
                          }
                          if (iVar18 < 1) {
LAB_00204cc3:
                            bVar3 = false;
                            auVar38 = _DAT_0020d110;
                            goto LAB_00204ce3;
                          }
                          pRVar22 = (REF_INT *)0x0;
                          pvVar11 = local_d0;
                          plVar14 = __ptr_00;
                          do {
                            if (0 < (int)uVar1) {
                              uVar29 = 0;
                              do {
                                plVar14[uVar29] = (long)*(int *)((long)pvVar11 + uVar29 * 4);
                                uVar29 = uVar29 + 1;
                              } while (uVar6 != uVar29);
                            }
                            pRVar22 = (REF_INT *)((long)pRVar22 + 1);
                            plVar14 = plVar14 + lVar13;
                            pvVar11 = (void *)((long)pvVar11 + local_98);
                          } while (pRVar22 != pRVar21);
                        }
                        else {
                          sVar28 = fread(local_a0,8,sVar17,(FILE *)file);
                          if (sVar28 != sVar17) {
                            pcVar26 = "long c2n";
                            uVar15 = 0x1dc;
                            goto LAB_00205615;
                          }
                          uVar29 = 0;
                          if (iVar18 < 1) goto LAB_00204cc3;
                          iVar16 = 0;
                          pRVar22 = pRVar21;
                          auVar38 = _DAT_0020d110;
                          do {
                            if (0 < (int)uVar1) {
                              memcpy(__ptr_00 + uVar29,(void *)((long)local_a0 + (long)iVar16 * 8),
                                     local_60);
                              auVar38 = _DAT_0020d110;
                            }
                            iVar16 = iVar16 + (int)local_80;
                            uVar29 = (ulong)((int)uVar29 + uVar1);
                            pRVar22 = (REF_INT *)((long)pRVar22 - 1);
                          } while (pRVar22 != (REF_INT *)0x0);
                        }
LAB_00204c4f:
                        bVar3 = 0 < iVar18;
                        if (0 < iVar18) {
                          pRVar22 = (REF_INT *)0x0;
                          plVar14 = __ptr_00;
                          do {
                            if (0 < (int)uVar2) {
                              uVar29 = 0;
                              do {
                                plVar14[uVar29] = plVar14[uVar29] + -1;
                                uVar29 = uVar29 + 1;
                              } while (local_a8 != uVar29);
                            }
                            pRVar22 = (REF_INT *)((long)pRVar22 + 1);
                            plVar14 = plVar14 + lVar13;
                            ref_cell = local_b8;
                          } while (pRVar22 != pRVar21);
                          goto LAB_00204ce3;
                        }
                        uVar29 = (ulong)(uint)ref_mpi->n;
LAB_00204db1:
                        bVar3 = false;
                      }
                      else {
                        pvVar11 = local_d0;
                        pRVar22 = pRVar21;
                        pRVar4 = pRVar21;
                        if (0 < iVar18) {
                          do {
                            local_c0 = pRVar4;
                            sVar17 = local_88;
                            sVar28 = fread(pvVar11,4,local_88,(FILE *)file);
                            if (sVar28 != sVar17) {
                              pcVar26 = "int c2n pad node";
                              uVar15 = 0x1c8;
                              sVar17 = local_88;
                              goto LAB_00205615;
                            }
                            sVar28 = fread(local_34,4,1,(FILE *)file);
                            if (sVar28 != 1) {
                              pcVar26 = "int c2n pad zero";
                              uVar15 = 0x1c9;
                              sVar17 = 1;
                              goto LAB_00205615;
                            }
                            sVar28 = fread((void *)((long)pvVar11 + local_48),4,1,(FILE *)file);
                            auVar38 = _DAT_0020d110;
                            if (sVar28 != 1) {
                              pcVar26 = "int c2n pad tag";
                              uVar15 = 0x1cd;
                              sVar17 = 1;
                              goto LAB_00205615;
                            }
                            pRVar22 = (REF_INT *)((long)pRVar22 - 1);
                            pvVar11 = (void *)((long)pvVar11 + local_98);
                            pRVar4 = local_c0;
                          } while (pRVar22 != (REF_INT *)0x0);
                          ref_cell = local_b8;
                          if (iVar18 < 1) goto LAB_00204cc3;
                          pRVar22 = (REF_INT *)0x0;
                          pvVar11 = local_d0;
                          plVar14 = __ptr_00;
                          do {
                            if (0 < (int)uVar1) {
                              uVar29 = 0;
                              do {
                                plVar14[uVar29] = (long)*(int *)((long)pvVar11 + uVar29 * 4);
                                uVar29 = uVar29 + 1;
                              } while (uVar6 != uVar29);
                            }
                            pRVar22 = (REF_INT *)((long)pRVar22 + 1);
                            plVar14 = plVar14 + lVar13;
                            pvVar11 = (void *)((long)pvVar11 + local_98);
                          } while (pRVar22 != local_c0);
                          goto LAB_00204c4f;
                        }
                        bVar3 = false;
LAB_00204ce3:
                        if ((ref_cell->type == REF_CELL_PYR) &&
                           (pRVar22 = pRVar21, plVar14 = local_58, bVar3)) {
                          do {
                            lVar12 = *plVar14;
                            lVar7 = plVar14[1];
                            *plVar14 = plVar14[-2];
                            plVar14[1] = plVar14[-1];
                            plVar14[-2] = lVar12;
                            plVar14[-1] = lVar7;
                            pRVar22 = (REF_INT *)((long)pRVar22 - 1);
                            plVar14 = plVar14 + lVar13;
                          } while (pRVar22 != (REF_INT *)0x0);
                        }
                        uVar29 = (ulong)(uint)ref_mpi->n;
                        if (!bVar3) goto LAB_00204db1;
                        lVar7 = (long)ref_mpi->n;
                        lVar12 = (local_90 + lVar7) / lVar7;
                        lVar8 = local_b0 - (local_90 / lVar7) * lVar7;
                        pRVar22 = (REF_INT *)0x0;
                        plVar14 = __ptr_00;
                        do {
                          lVar24 = *plVar14 / lVar12;
                          if (lVar8 <= lVar24) {
                            lVar24 = (*plVar14 - lVar12 * lVar8) / (local_90 / lVar7) + lVar8;
                          }
                          *(int *)((long)local_e0 + (long)pRVar22 * 4) = (int)lVar24;
                          pRVar22 = (REF_INT *)((long)pRVar22 + 1);
                          plVar14 = plVar14 + lVar13;
                        } while (pRVar21 != pRVar22);
                      }
                      iVar16 = (int)uVar29;
                      if (0 < iVar16) {
                        lVar12 = uVar29 - 1;
                        auVar31._8_4_ = (int)lVar12;
                        auVar31._0_8_ = lVar12;
                        auVar31._12_4_ = (int)((ulong)lVar12 >> 0x20);
                        auVar31 = auVar31 ^ auVar38;
                        lVar12 = 0;
                        auVar35 = _DAT_0020d100;
                        auVar36 = _DAT_0020d0f0;
                        do {
                          auVar34 = auVar35 ^ auVar38;
                          iVar23 = auVar31._4_4_;
                          if ((bool)(~(auVar34._4_4_ == iVar23 && auVar31._0_4_ < auVar34._0_4_ ||
                                      iVar23 < auVar34._4_4_) & 1)) {
                            *(undefined4 *)((long)__ptr + lVar12) = 0;
                          }
                          if ((auVar34._12_4_ != auVar31._12_4_ || auVar34._8_4_ <= auVar31._8_4_)
                              && auVar34._12_4_ <= auVar31._12_4_) {
                            *(undefined4 *)((long)__ptr + lVar12 + 4) = 0;
                          }
                          iVar37 = SUB164(auVar36 ^ auVar38,4);
                          if (iVar37 <= iVar23 &&
                              (iVar37 != iVar23 || SUB164(auVar36 ^ auVar38,0) <= auVar31._0_4_)) {
                            *(undefined4 *)((long)__ptr + lVar12 + 8) = 0;
                            *(undefined4 *)((long)__ptr + lVar12 + 0xc) = 0;
                          }
                          lVar7 = auVar35._8_8_;
                          auVar35._0_8_ = auVar35._0_8_ + 4;
                          auVar35._8_8_ = lVar7 + 4;
                          lVar7 = auVar36._8_8_;
                          auVar36._0_8_ = auVar36._0_8_ + 4;
                          auVar36._8_8_ = lVar7 + 4;
                          lVar12 = lVar12 + 0x10;
                        } while ((ulong)(iVar16 + 3U >> 2) << 4 != lVar12);
                      }
                      if (bVar3) {
                        pRVar22 = (REF_INT *)0x0;
                        do {
                          __ptr[*(int *)((long)local_e0 + (long)pRVar22 * 4)] =
                               __ptr[*(int *)((long)local_e0 + (long)pRVar22 * 4)] + 1;
                          pRVar22 = (REF_INT *)((long)pRVar22 + 1);
                        } while (pRVar21 != pRVar22);
                      }
                      *local_e8 = 0;
                      if (1 < iVar16) {
                        lVar12 = 0;
                        iVar23 = 0;
                        do {
                          iVar23 = iVar23 + __ptr[lVar12];
                          local_e8[lVar12 + 1] = iVar23;
                          lVar12 = lVar12 + 1;
                        } while (uVar29 - 1 != lVar12);
                      }
                      if (0 < iVar16) {
                        lVar12 = uVar29 - 1;
                        auVar32._8_4_ = (int)lVar12;
                        auVar32._0_8_ = lVar12;
                        auVar32._12_4_ = (int)((ulong)lVar12 >> 0x20);
                        lVar12 = 0;
                        auVar34 = _DAT_0020d100;
                        auVar33 = _DAT_0020d0f0;
                        do {
                          auVar35 = auVar32 ^ auVar38;
                          auVar36 = auVar34 ^ auVar38;
                          iVar23 = auVar35._4_4_;
                          if ((bool)(~(iVar23 < auVar36._4_4_ ||
                                      auVar35._0_4_ < auVar36._0_4_ && auVar36._4_4_ == iVar23) & 1)
                             ) {
                            *(undefined4 *)((long)__ptr + lVar12) = 0;
                          }
                          if (auVar36._12_4_ <= auVar35._12_4_ &&
                              (auVar36._8_4_ <= auVar35._8_4_ || auVar36._12_4_ != auVar35._12_4_))
                          {
                            *(undefined4 *)((long)__ptr + lVar12 + 4) = 0;
                          }
                          iVar37 = SUB164(auVar33 ^ auVar38,4);
                          if (iVar37 <= iVar23 &&
                              (iVar37 != iVar23 || SUB164(auVar33 ^ auVar38,0) <= auVar35._0_4_)) {
                            *(undefined4 *)((long)__ptr + lVar12 + 8) = 0;
                            *(undefined4 *)((long)__ptr + lVar12 + 0xc) = 0;
                          }
                          lVar7 = auVar34._8_8_;
                          auVar34._0_8_ = auVar34._0_8_ + 4;
                          auVar34._8_8_ = lVar7 + 4;
                          lVar7 = auVar33._8_8_;
                          auVar33._0_8_ = auVar33._0_8_ + 4;
                          auVar33._8_8_ = lVar7 + 4;
                          lVar12 = lVar12 + 0x10;
                        } while ((ulong)(iVar16 + 3U >> 2) << 4 != lVar12);
                      }
                      if (bVar3) {
                        uVar30 = 0;
                        pRVar22 = (REF_INT *)0x0;
                        local_c8 = pRVar21;
                        do {
                          pRVar21 = (REF_INT *)(long)*(int *)((long)local_e0 + (long)pRVar22 * 4);
                          iVar23 = __ptr[(long)pRVar21];
                          if (0 < (int)uVar1) {
                            local_c0 = pRVar21;
                            memcpy(c2n + (int)((local_e8[(long)pRVar21] + iVar23) * uVar1),
                                   __ptr_00 + uVar30,local_60);
                            pRVar21 = local_c0;
                            auVar38 = _DAT_0020d110;
                          }
                          __ptr[(long)pRVar21] = iVar23 + 1;
                          pRVar22 = (REF_INT *)((long)pRVar22 + 1);
                          uVar30 = (ulong)((int)uVar30 + uVar1);
                        } while (local_c8 != pRVar22);
                      }
                      iVar23 = *__ptr;
                      if (0 < (long)iVar23) {
                        uVar5 = iVar23 * uVar1;
                        if ((int)uVar5 < 0) {
                          pcVar26 = "malloc sent_part of REF_INT negative";
                          uVar15 = 0x215;
                          goto LAB_002047f3;
                        }
                        pRVar21 = (REF_INT *)malloc((ulong)uVar5 << 2);
                        if (pRVar21 == (REF_INT *)0x0) {
                          pcVar26 = "malloc sent_part of REF_INT NULL";
                          uVar15 = 0x215;
                          goto LAB_00204825;
                        }
                        local_c8 = pRVar21;
                        if (uVar1 != 0) {
                          memset(pRVar21,0xff,(ulong)(uVar5 + (uVar5 == 0)) << 2);
                        }
                        pRVar21 = local_c8;
                        lVar7 = (long)iVar16;
                        local_c0 = (REF_INT *)(local_90 + lVar7);
                        lVar12 = 0;
                        pRVar22 = local_c8;
                        pRVar25 = c2n;
                        do {
                          if (0 < (int)uVar2) {
                            lVar8 = local_b0 - (local_90 / lVar7) * lVar7;
                            uVar29 = 0;
                            do {
                              lVar24 = pRVar25[uVar29] / ((long)local_c0 / lVar7);
                              if (lVar8 <= lVar24) {
                                lVar24 = (pRVar25[uVar29] - ((long)local_c0 / lVar7) * lVar8) /
                                         (local_90 / lVar7) + lVar8;
                              }
                              pRVar22[uVar29] = (REF_INT)lVar24;
                              uVar29 = uVar29 + 1;
                            } while (local_a8 != uVar29);
                          }
                          lVar12 = lVar12 + 1;
                          pRVar25 = pRVar25 + lVar13;
                          pRVar22 = (REF_INT *)((long)pRVar22 + local_40);
                        } while (lVar12 != iVar23);
                        uVar5 = ref_cell_add_many_global
                                          (local_b8,local_78,iVar23,c2n,local_c8,ref_mpi->id);
                        if (uVar5 != 0) {
                          pcVar26 = "glob";
                          uVar15 = 0x21e;
                          goto LAB_00205462;
                        }
                        free(pRVar21);
                        uVar29 = (ulong)(uint)ref_mpi->n;
                        auVar38 = _DAT_0020d110;
                      }
                      iVar16 = (int)uVar29;
                      if (1 < iVar16) {
                        lVar12 = 1;
                        lVar7 = 4;
                        do {
                          if (0 < __ptr[lVar12]) {
                            uVar5 = ref_mpi_scatter_send
                                              (ref_mpi,(void *)((long)__ptr + lVar7),1,1,
                                               (REF_INT)lVar12);
                            if (uVar5 != 0) {
                              pcVar26 = "send";
                              uVar15 = 0x227;
                              goto LAB_00205462;
                            }
                            uVar5 = ref_mpi_scatter_send
                                              (ref_mpi,c2n + (long)(int)uVar1 *
                                                             (long)(int)local_e8[lVar12],
                                               __ptr[lVar12] * uVar1,2,(REF_INT)lVar12);
                            if (uVar5 != 0) {
                              pcVar26 = "send";
                              uVar15 = 0x22b;
                              goto LAB_00205462;
                            }
                            uVar29 = (ulong)(uint)ref_mpi->n;
                            auVar38 = _DAT_0020d110;
                          }
                          lVar12 = lVar12 + 1;
                          iVar16 = (int)uVar29;
                          lVar7 = lVar7 + 4;
                        } while (lVar12 < iVar16);
                      }
                      lVar12 = local_50 + iVar18;
                      ref_cell = local_b8;
                    } while (lVar12 < (long)local_d8);
                  }
                  free(local_e0);
                  free(local_a0);
                  free(local_d0);
                  free(__ptr_00);
                  free(local_e8);
                  free(__ptr);
                  if (1 < iVar16) {
                    iVar16 = 1;
                    do {
                      uVar5 = ref_mpi_scatter_send(ref_mpi,&local_64,1,1,iVar16);
                      if (uVar5 != 0) {
                        pcVar26 = "send";
                        uVar15 = 0x23a;
                        goto LAB_00205462;
                      }
                      iVar16 = iVar16 + 1;
                    } while (iVar16 < ref_mpi->n);
                  }
                  goto LAB_00204788;
                }
                pcVar26 = "malloc dest of REF_INT NULL";
                uVar15 = 0x1bc;
              }
            }
          }
        }
      }
    }
LAB_00204825:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar15,
           "ref_part_meshb_cell",pcVar26);
    RVar19 = 2;
  }
  return RVar19;
}

Assistant:

REF_FCN static REF_STATUS ref_part_meshb_cell(REF_CELL ref_cell, REF_LONG ncell,
                                              REF_NODE ref_node, REF_LONG nnode,
                                              REF_INT version, REF_BOOL pad,
                                              FILE *file) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_LONG ncell_read;
  REF_INT chunk;
  REF_INT end_of_message = REF_EMPTY;
  REF_INT elements_to_receive;
  REF_GLOB *c2n;
  REF_INT *c2n_int;
  REF_LONG *c2n_long;
  REF_GLOB *sent_c2n;
  REF_INT *dest;
  REF_INT *sent_part;
  REF_INT *elements_to_send;
  REF_INT *start_to_send;
  REF_INT node_per, size_per;
  REF_INT section_size;
  REF_INT cell;
  REF_INT part, node;
  REF_INT ncell_keep;
  REF_INT new_location;
  size_t nread;

  chunk = (REF_INT)MAX(1000000, ncell / (REF_LONG)ref_mpi_n(ref_mpi));

  node_per = ref_cell_node_per(ref_cell);
  size_per = ref_cell_size_per(ref_cell);

  ref_malloc(sent_c2n, size_per * chunk, REF_GLOB);

  if (ref_mpi_once(ref_mpi)) {
    ref_malloc(elements_to_send, ref_mpi_n(ref_mpi), REF_INT);
    ref_malloc(start_to_send, ref_mpi_n(ref_mpi), REF_INT);
    ref_malloc(c2n, size_per * chunk, REF_GLOB);
    ref_malloc(c2n_int, (node_per + 1) * chunk, REF_INT);
    ref_malloc(c2n_long, (node_per + 1) * chunk, REF_LONG);
    ref_malloc(dest, chunk, REF_INT);

    ncell_read = 0;
    while (ncell_read < ncell) {
      section_size = MIN(chunk, (REF_INT)(ncell - ncell_read));
      nread = (size_t)(section_size * (1 + node_per));
      if (pad) {
        for (cell = 0; cell < section_size; cell++) {
          REF_INT zero;
          REIS(node_per,
               fread(&(c2n_int[(node_per + 1) * cell]), sizeof(REF_INT),
                     (size_t)node_per, file),
               "int c2n pad node");
          REIS(1, fread(&(zero), sizeof(REF_INT), 1, file), "int c2n pad zero");
          REIS(1,
               fread(&(c2n_int[node_per + (node_per + 1) * cell]),
                     sizeof(REF_INT), 1, file),
               "int c2n pad tag");
        }
        for (cell = 0; cell < section_size; cell++)
          for (node = 0; node < size_per; node++)
            c2n[node + size_per * cell] =
                (REF_GLOB)c2n_int[node + (node_per + 1) * cell];
      } else {
        if (version < 4) {
          REIS(nread, fread(c2n_int, sizeof(REF_INT), nread, file), "int c2n");
          for (cell = 0; cell < section_size; cell++)
            for (node = 0; node < size_per; node++)
              c2n[node + size_per * cell] =
                  (REF_GLOB)c2n_int[node + (node_per + 1) * cell];
        } else {
          REIS(nread, fread(c2n_long, sizeof(REF_LONG), nread, file),
               "long c2n");
          for (cell = 0; cell < section_size; cell++)
            for (node = 0; node < size_per; node++)
              c2n[node + size_per * cell] =
                  (REF_GLOB)c2n_long[node + (node_per + 1) * cell];
        }
      }
      for (cell = 0; cell < section_size; cell++)
        for (node = 0; node < node_per; node++) c2n[node + size_per * cell]--;

      if (REF_CELL_PYR == ref_cell_type(ref_cell)) {
        REF_GLOB n0, n1, n2, n3, n4;
        /* convention: square basis is 0-1-2-3
           (oriented counter clockwise like trias) and top vertex is 4 */
        for (cell = 0; cell < section_size; cell++) {
          n0 = c2n[0 + size_per * cell];
          n1 = c2n[1 + size_per * cell];
          n2 = c2n[2 + size_per * cell];
          n3 = c2n[3 + size_per * cell];
          n4 = c2n[4 + size_per * cell];
          c2n[0 + size_per * cell] = n0;
          c2n[3 + size_per * cell] = n1;
          c2n[4 + size_per * cell] = n2;
          c2n[1 + size_per * cell] = n3;
          c2n[2 + size_per * cell] = n4;
        }
      }

      ncell_read += section_size;

      for (cell = 0; cell < section_size; cell++)
        dest[cell] =
            ref_part_implicit(nnode, ref_mpi_n(ref_mpi), c2n[size_per * cell]);

      each_ref_mpi_part(ref_mpi, part) elements_to_send[part] = 0;
      for (cell = 0; cell < section_size; cell++)
        elements_to_send[dest[cell]]++;

      start_to_send[0] = 0;
      each_ref_mpi_worker(ref_mpi, part) {
        start_to_send[part] =
            start_to_send[part - 1] + elements_to_send[part - 1];
      }

      each_ref_mpi_part(ref_mpi, part) elements_to_send[part] = 0;
      for (cell = 0; cell < section_size; cell++) {
        new_location = start_to_send[dest[cell]] + elements_to_send[dest[cell]];
        for (node = 0; node < size_per; node++)
          sent_c2n[node + size_per * new_location] =
              c2n[node + size_per * cell];
        elements_to_send[dest[cell]]++;
      }

      /* rank 0 keepers */

      ncell_keep = elements_to_send[0];
      if (0 < ncell_keep) {
        ref_malloc_init(sent_part, size_per * ncell_keep, REF_INT, REF_EMPTY);

        for (cell = 0; cell < ncell_keep; cell++)
          for (node = 0; node < node_per; node++)
            sent_part[node + size_per * cell] = ref_part_implicit(
                nnode, ref_mpi_n(ref_mpi), sent_c2n[node + size_per * cell]);

        RSS(ref_cell_add_many_global(ref_cell, ref_node, ncell_keep, sent_c2n,
                                     sent_part, ref_mpi_rank(ref_mpi)),
            "glob");

        ref_free(sent_part);
      }

      each_ref_mpi_worker(ref_mpi, part) {
        if (0 < elements_to_send[part]) {
          RSS(ref_mpi_scatter_send(ref_mpi, &(elements_to_send[part]), 1,
                                   REF_INT_TYPE, part),
              "send");
          RSS(ref_mpi_scatter_send(
                  ref_mpi, &(sent_c2n[size_per * start_to_send[part]]),
                  size_per * elements_to_send[part], REF_GLOB_TYPE, part),
              "send");
        }
      }
    }

    ref_free(dest);
    ref_free(c2n_long);
    ref_free(c2n_int);
    ref_free(c2n);
    ref_free(start_to_send);
    ref_free(elements_to_send);

    /* signal we are done */
    each_ref_mpi_worker(ref_mpi, part) {
      RSS(ref_mpi_scatter_send(ref_mpi, &end_of_message, 1, REF_INT_TYPE, part),
          "send");
    }
  } else {
    do {
      RSS(ref_mpi_scatter_recv(ref_mpi, &elements_to_receive, 1, REF_INT_TYPE),
          "recv");
      if (elements_to_receive > 0) {
        RSS(ref_mpi_scatter_recv(ref_mpi, sent_c2n,
                                 size_per * elements_to_receive, REF_GLOB_TYPE),
            "send");

        ref_malloc_init(sent_part, size_per * elements_to_receive, REF_INT,
                        REF_EMPTY);

        for (cell = 0; cell < elements_to_receive; cell++)
          for (node = 0; node < node_per; node++)
            sent_part[node + size_per * cell] = ref_part_implicit(
                nnode, ref_mpi_n(ref_mpi), sent_c2n[node + size_per * cell]);

        RSS(ref_cell_add_many_global(ref_cell, ref_node, elements_to_receive,
                                     sent_c2n, sent_part,
                                     ref_mpi_rank(ref_mpi)),
            "many glob");

        ref_free(sent_part);
      }
    } while (elements_to_receive != end_of_message);
  }

  free(sent_c2n);

  RSS(ref_migrate_shufflin_cell(ref_node, ref_cell), "fill ghosts");

  return REF_SUCCESS;
}